

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

bool from_issue_342::test_uintwide_t_spot_values_from_issue_342_mix(void)

{
  enable_if_t<(true____true),_int> *in_R8;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mm;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_mp;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pm;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  r_pp;
  representation_type local_f0;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  local_e0;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  local_c0;
  representation_type local_a0;
  uintwide_t<128U,_unsigned_int,_void,_true> local_90;
  undefined4 local_80;
  undefined8 local_7c;
  undefined4 local_74;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  local_70;
  pair<math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>,_math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>_>
  local_50;
  
  local_80 = 0x11;
  local_74 = 0;
  local_7c = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[0] = 4;
  local_90.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_50,(wide_integer *)&local_80,&local_90,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_c0.first =
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-(&local_90);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_70,(wide_integer *)&local_80,&local_c0.first,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_e0.first =
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)&local_80);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_c0,(wide_integer *)&local_e0,&local_90,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_a0.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)&local_80);
  local_f0.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-(&local_90);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_e0,(wide_integer *)&local_a0,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)&local_f0,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_80 = 0xc;
  local_7c = 0;
  local_74 = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[0] = 3;
  local_90.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_50,(wide_integer *)&local_80,&local_90,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_c0.first =
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-(&local_90);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_70,(wide_integer *)&local_80,&local_c0.first,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_e0.first =
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)&local_80);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_c0,(wide_integer *)&local_e0,&local_90,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_a0.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)&local_80);
  local_f0.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-(&local_90);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_e0,(wide_integer *)&local_a0,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)&local_f0,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_80 = 0x20;
  local_7c = 0;
  local_74 = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[0] = 0x73;
  local_90.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_90.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_50,(wide_integer *)&local_80,&local_90,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_c0.first =
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-(&local_90);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_70,(wide_integer *)&local_80,&local_c0.first,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_e0.first =
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)&local_80);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_c0,(wide_integer *)&local_e0,&local_90,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  local_a0.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-
                 ((uintwide_t<128U,_unsigned_int,_void,_true> *)&local_80);
  local_f0.super_array<unsigned_int,_4UL>.elems =
       (array<unsigned_int,_4UL>)
       math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_true>::operator-(&local_90);
  math::wide_integer::divmod<128u,unsigned_int,void,true,true>
            (&local_e0,(wide_integer *)&local_a0,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)&local_f0,
             (uintwide_t<128U,_unsigned_int,_void,_true> *)0x0,in_R8);
  return true;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_342_mix() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/342

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_int128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::int128_t;
    #else
    using local_int128_t = ::math::wide_integer::int128_t;
    #endif

    auto result_is_ok = true;

    {
      const local_int128_t a = 17;
      const local_int128_t b =  4;

      const auto r_pp = divmod(+a, +b);
      const auto r_pm = divmod(+a, -b);
      const auto r_mp = divmod(-a, +b);
      const auto r_mm = divmod(-a, -b);

      const auto result_pp_is_ok = ((r_pp.first == +4) && (r_pp.second == +1));
      const auto result_pm_is_ok = ((r_pm.first == -5) && (r_pm.second == -3));
      const auto result_mp_is_ok = ((r_mp.first == -5) && (r_mp.second == +3));
      const auto result_mm_is_ok = ((r_mm.first == +4) && (r_mm.second == -1));

      const auto result_divmod_is_ok =
      (
           result_pp_is_ok
        && result_pm_is_ok
        && result_mp_is_ok
        && result_mm_is_ok
      );

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    {
      const local_int128_t a = 12;
      const local_int128_t b =  3;

      const auto r_pp = divmod(+a, +b);
      const auto r_pm = divmod(+a, -b);
      const auto r_mp = divmod(-a, +b);
      const auto r_mm = divmod(-a, -b);

      const auto result_pp_is_ok = ((r_pp.first == +4) && (r_pp.second == 0));
      const auto result_pm_is_ok = ((r_pm.first == -4) && (r_pm.second == 0));
      const auto result_mp_is_ok = ((r_mp.first == -4) && (r_mp.second == 0));
      const auto result_mm_is_ok = ((r_mm.first == +4) && (r_mm.second == 0));

      const auto result_divmod_is_ok =
      (
           result_pp_is_ok
        && result_pm_is_ok
        && result_mp_is_ok
        && result_mm_is_ok
      );

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    {
      const local_int128_t a =  32;
      const local_int128_t b = 115;

      const auto r_pp = divmod(+a, +b);
      const auto r_pm = divmod(+a, -b);
      const auto r_mp = divmod(-a, +b);
      const auto r_mm = divmod(-a, -b);

      const auto result_pp_is_ok = ((r_pp.first == +0) && (r_pp.second == +32));
      const auto result_pm_is_ok = ((r_pm.first == -1) && (r_pm.second == -83));
      const auto result_mp_is_ok = ((r_mp.first == -1) && (r_mp.second == +83));
      const auto result_mm_is_ok = ((r_mm.first == +0) && (r_mm.second == -32));

      const auto result_divmod_is_ok =
      (
           result_pp_is_ok
        && result_pm_is_ok
        && result_mp_is_ok
        && result_mm_is_ok
      );

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    return result_is_ok;
  }